

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 NavCalcPreferredRefPos(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  ImVec2 pos;
  ImRect visible_rect;
  ImVec2 local_20;
  ImRect local_18;
  
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar1 = GImGui->NavWindow, pIVar1 != (ImGuiWindow *)0x0)) {
    auVar4._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar2 = pIVar1->NavRectRel[GImGui->NavLayer].Min;
    IVar3 = pIVar1->NavRectRel[GImGui->NavLayer].Max;
    fVar7 = IVar3.y;
    fVar6 = IVar2.x;
    auVar4._4_4_ = (GImGui->Style).FramePadding.y;
    auVar4._8_8_ = 0;
    auVar5._4_4_ = fVar7 - IVar2.y;
    auVar5._0_4_ = IVar3.x - fVar6;
    auVar5._8_8_ = 0;
    auVar5 = minps(auVar4,auVar5);
    local_20.x = (pIVar1->Pos).x + fVar6 + auVar5._0_4_;
    local_20.y = (pIVar1->Pos).y + (fVar7 - auVar5._4_4_);
    local_18 = GetViewportRect();
    IVar2 = ImClamp(&local_20,&local_18.Min,local_18.Max);
  }
  else {
    IVar2 = (GImGui->IO).MousePos;
  }
  IVar3.x = (float)(int)IVar2.x;
  IVar3.y = (float)(int)IVar2.y;
  return IVar3;
}

Assistant:

static ImVec2 NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
        return ImFloor(g.IO.MousePos);

    // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item
    const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
    ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x*4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
    ImRect visible_rect = GetViewportRect();
    return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
}